

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::OgreImporter::SetupProperties(OgreImporter *this,Importer *pImp)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Scene.material",&local_59)
  ;
  Importer::GetPropertyString(&local_58,pImp,"IMPORT_OGRE_MATERIAL_FILE",&local_38);
  std::__cxx11::string::_M_assign((string *)&this->m_userDefinedMaterialLibFile);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_OGRE_TEXTURETYPE_FROM_FILENAME",false);
  this->m_detectTextureTypeFromFilename = bVar1;
  return;
}

Assistant:

void OgreImporter::SetupProperties(const Importer* pImp)
{
    m_userDefinedMaterialLibFile = pImp->GetPropertyString(AI_CONFIG_IMPORT_OGRE_MATERIAL_FILE, "Scene.material");
    m_detectTextureTypeFromFilename = pImp->GetPropertyBool(AI_CONFIG_IMPORT_OGRE_TEXTURETYPE_FROM_FILENAME, false);
}